

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Symbol>::copyAppend(QGenericArrayOps<Symbol> *this,Symbol *b,Symbol *e)

{
  Symbol *pSVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Token TVar4;
  long lVar5;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<Symbol>).ptr;
    lVar5 = (this->super_QArrayDataPointer<Symbol>).size;
    do {
      TVar4 = b->token;
      pSVar1[lVar5].lineNum = b->lineNum;
      pSVar1[lVar5].token = TVar4;
      pDVar2 = (b->lex).d.d;
      pSVar1[lVar5].lex.d.d = pDVar2;
      pSVar1[lVar5].lex.d.ptr = (b->lex).d.ptr;
      pSVar1[lVar5].lex.d.size = (b->lex).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qVar3 = b->len;
      pSVar1[lVar5].from = b->from;
      pSVar1[lVar5].len = qVar3;
      b = b + 1;
      lVar5 = (this->super_QArrayDataPointer<Symbol>).size + 1;
      (this->super_QArrayDataPointer<Symbol>).size = lVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }